

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool last_connection,bool *connection_close)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  __ssize_t _Var6;
  const_iterator cVar7;
  long lVar8;
  string *psVar9;
  undefined7 in_register_00000011;
  Headers *headers;
  char *pcVar10;
  string boundary;
  Response res;
  stream_line_reader reader;
  Request req;
  char buf [2048];
  key_type local_b18;
  undefined4 local_af4;
  Server *local_af0;
  string local_ae8;
  _Any_data local_ac8;
  code *local_ab8;
  undefined8 uStack_ab0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_aa0 [2];
  long local_a90 [2];
  Response local_a80;
  stream_line_reader local_9e8;
  undefined1 local_9a8 [128];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_928;
  string local_8f8;
  undefined1 local_8d8 [8];
  _Rb_tree_node_base local_8d0;
  size_t local_8b0;
  MultipartFiles local_8a8;
  pointer psStack_878;
  pointer local_870;
  pointer psStack_868;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_860;
  _Any_data _Stack_858;
  _Manager_type p_Stack_848;
  _Invoker_type local_840;
  char local_838 [2056];
  
  local_af4 = SUB84((size_t *)CONCAT71(in_register_00000011,last_connection),0);
  paVar2 = &local_9e8.glowable_buffer_.field_2;
  local_9e8.fixed_buffer_ = local_838;
  local_9e8.fixed_buffer_size_ = 0x800;
  local_9e8.glowable_buffer_._M_string_length = 0;
  local_9e8.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  local_9e8.strm_ = strm;
  local_9e8.glowable_buffer_._M_dataplus._M_p = (pointer)paVar2;
  _Var6 = detail::stream_line_reader::getline
                    (&local_9e8,(char **)strm,
                     (size_t *)CONCAT71(in_register_00000011,last_connection),
                     (FILE *)connection_close);
  if ((char)_Var6 == '\0') goto LAB_00144ae6;
  local_9a8._0_8_ = local_9a8 + 0x10;
  local_9a8._8_8_ = 0;
  local_9a8[0x10] = '\0';
  local_9a8._32_8_ = local_9a8 + 0x30;
  local_9a8._40_8_ = 0;
  local_9a8[0x30] = '\0';
  local_9a8._64_8_ = local_9a8 + 0x50;
  local_9a8._72_8_ = 0;
  local_9a8[0x50] = '\0';
  local_9a8._96_8_ = local_9a8 + 0x70;
  local_9a8._104_8_ = 0;
  local_9a8[0x70] = '\0';
  local_928._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_928._M_impl.super__Rb_tree_header._M_header;
  local_928._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_928._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_928._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  local_8f8._M_string_length = 0;
  local_8f8.field_2._M_local_buf[0] = '\0';
  local_8d0._M_left = &local_8d0;
  local_8d0._M_color = _S_red;
  local_8d0._M_parent = (_Base_ptr)0x0;
  local_8b0 = 0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_8a8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_840 = (_Invoker_type)0x0;
  _Stack_858._8_8_ = 0;
  p_Stack_848 = (_Manager_type)0x0;
  local_860._M_current = (char *)0x0;
  _Stack_858._M_unused._M_object = (void *)0x0;
  local_870 = (pointer)0x0;
  psStack_868 = (pointer)0x0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psStack_878 = (pointer)0x0;
  local_a80.version._M_dataplus._M_p = (pointer)&local_a80.version.field_2;
  local_a80.version._M_string_length = 0;
  local_a80.version.field_2._M_local_buf[0] = '\0';
  local_a80.status = -1;
  local_a80.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a80.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a80.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a80.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a80.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a80.body._M_dataplus._M_p = (pointer)&local_a80.body.field_2;
  local_a80.body._M_string_length = 0;
  local_a80.body.field_2._M_local_buf[0] = '\0';
  local_a80.streamcb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a80.streamcb.super__Function_base._M_functor._8_8_ = 0;
  local_a80.streamcb.super__Function_base._M_manager = (_Manager_type)0x0;
  local_a80.streamcb._M_invoker = (_Invoker_type)0x0;
  local_a80.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a80.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_928._M_impl.super__Rb_tree_header._M_header._M_right =
       local_928._M_impl.super__Rb_tree_header._M_header._M_left;
  local_8d0._M_right = local_8d0._M_left;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_replace((ulong)&local_a80,0,(char *)0x0,0x15c515);
  psVar9 = &local_9e8.glowable_buffer_;
  if (local_9e8.glowable_buffer_._M_string_length == 0) {
    psVar9 = (string *)&local_9e8.fixed_buffer_;
  }
  bVar3 = parse_request_line(this,(psVar9->_M_dataplus)._M_p,(Request *)local_9a8);
  iVar5 = 400;
  local_af0 = this;
  if ((bVar3) && (bVar3 = detail::read_headers((detail *)strm,(Stream *)&local_928,headers), bVar3))
  {
    local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"Connection","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_928,&local_b18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
      operator_delete(local_b18._M_dataplus._M_p,
                      CONCAT71(local_b18.field_2._M_allocated_capacity._1_7_,
                               local_b18.field_2._M_local_buf[0]) + 1);
    }
    if ((_Rb_tree_header *)cVar7._M_node == &local_928._M_impl.super__Rb_tree_header) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)(cVar7._M_node + 2);
    }
    std::__cxx11::string::string((string *)&local_ae8,pcVar10,(allocator *)&local_b18);
    iVar4 = std::__cxx11::string::compare((char *)&local_ae8);
    paVar1 = &local_ae8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ae8._M_dataplus._M_p != paVar1) {
      operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
    }
    if (iVar4 == 0) {
      *connection_close = true;
    }
    (*strm->_vptr_Stream[5])(&local_b18,strm);
    local_ae8._M_dataplus._M_p = "REMOTE_ADDR";
    local_aa0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b18._M_dataplus._M_p;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_928,(char **)&local_ae8,(char **)local_aa0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
      operator_delete(local_b18._M_dataplus._M_p,
                      CONCAT71(local_b18.field_2._M_allocated_capacity._1_7_,
                               local_b18.field_2._M_local_buf[0]) + 1);
    }
    iVar4 = std::__cxx11::string::compare(local_9a8 + 0x20);
    if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(local_9a8 + 0x20), iVar4 != 0)) {
LAB_00144a05:
      bVar3 = routing(local_af0,(Request *)local_9a8,&local_a80);
      iVar5 = 0x194;
      if ((bVar3) && (iVar5 = local_a80.status, local_a80.status == -1)) {
        iVar5 = 200;
      }
      goto LAB_00144a3e;
    }
    local_ab8 = (code *)0x0;
    uStack_ab0 = 0;
    local_ac8._M_unused._M_object = (void *)0x0;
    local_ac8._8_8_ = 0;
    bVar3 = detail::read_content<httplib::Request>(strm,(Request *)local_9a8,(Progress *)&local_ac8)
    ;
    if (local_ab8 != (code *)0x0) {
      (*local_ab8)(&local_ac8,&local_ac8,__destroy_functor);
    }
    if (!bVar3) goto LAB_00144a3e;
    local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"Content-Type","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_928,&local_b18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
      operator_delete(local_b18._M_dataplus._M_p,
                      CONCAT71(local_b18.field_2._M_allocated_capacity._1_7_,
                               local_b18.field_2._M_local_buf[0]) + 1);
    }
    if ((_Rb_tree_header *)cVar7._M_node == &local_928._M_impl.super__Rb_tree_header) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)(cVar7._M_node + 2);
    }
    std::__cxx11::string::string((string *)&local_ae8,pcVar10,(allocator *)&local_b18);
    local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"Content-Encoding","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_928,&local_b18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
      operator_delete(local_b18._M_dataplus._M_p,
                      CONCAT71(local_b18.field_2._M_allocated_capacity._1_7_,
                               local_b18.field_2._M_local_buf[0]) + 1);
    }
    if ((_Rb_tree_header *)cVar7._M_node == &local_928._M_impl.super__Rb_tree_header) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)(cVar7._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_aa0,pcVar10,(allocator *)&local_b18);
    iVar5 = std::__cxx11::string::compare((char *)local_aa0);
    if (local_aa0[0] !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a90) {
      operator_delete(local_aa0[0],local_a90[0] + 1);
    }
    if (iVar5 != 0) {
      lVar8 = std::__cxx11::string::find((char *)&local_ae8,0x15c551,0);
      if (lVar8 == 0) {
        detail::
        split<httplib::detail::parse_query_text(std::__cxx11::string_const&,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(char_const*,char_const*)_1_>
                  (local_8f8._M_dataplus._M_p,
                   local_8f8._M_dataplus._M_p + local_8f8._M_string_length,'&',(Params *)local_8d8);
      }
      else {
        lVar8 = std::__cxx11::string::find((char *)&local_ae8,0x15c573,0);
        if (lVar8 == 0) {
          local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
          local_b18._M_string_length = 0;
          local_b18.field_2._M_local_buf[0] = '\0';
          bVar3 = detail::parse_multipart_boundary(&local_ae8,&local_b18);
          if ((!bVar3) ||
             (bVar3 = detail::parse_multipart_formdata(&local_b18,&local_8f8,&local_8a8), !bVar3)) {
            local_a80.status = 400;
            write_response(local_af0,strm,local_af4._0_1_,(Request *)local_9a8,&local_a80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
              operator_delete(local_b18._M_dataplus._M_p,
                              CONCAT71(local_b18.field_2._M_allocated_capacity._1_7_,
                                       local_b18.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_001449b1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
            operator_delete(local_b18._M_dataplus._M_p,
                            CONCAT71(local_b18.field_2._M_allocated_capacity._1_7_,
                                     local_b18.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ae8._M_dataplus._M_p != paVar1) {
        operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00144a05;
    }
    local_a80.status = 0x19f;
    write_response(local_af0,strm,local_af4._0_1_,(Request *)local_9a8,&local_a80);
LAB_001449b1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ae8._M_dataplus._M_p != paVar1) {
      operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_00144a3e:
    local_a80.status = iVar5;
    write_response(local_af0,strm,local_af4._0_1_,(Request *)local_9a8,&local_a80);
  }
  if (local_a80.streamcb.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a80.streamcb.super__Function_base._M_manager)
              ((_Any_data *)&local_a80.streamcb,(_Any_data *)&local_a80.streamcb,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80.body._M_dataplus._M_p != &local_a80.body.field_2) {
    operator_delete(local_a80.body._M_dataplus._M_p,
                    CONCAT71(local_a80.body.field_2._M_allocated_capacity._1_7_,
                             local_a80.body.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a80.headers._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80.version._M_dataplus._M_p != &local_a80.version.field_2) {
    operator_delete(local_a80.version._M_dataplus._M_p,
                    CONCAT71(local_a80.version.field_2._M_allocated_capacity._1_7_,
                             local_a80.version.field_2._M_local_buf[0]) + 1);
  }
  Request::~Request((Request *)local_9a8);
LAB_00144ae6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8.glowable_buffer_._M_dataplus._M_p != paVar2) {
    operator_delete(local_9e8.glowable_buffer_._M_dataplus._M_p,
                    CONCAT71(local_9e8.glowable_buffer_.field_2._M_allocated_capacity._1_7_,
                             local_9e8.glowable_buffer_.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(char)_Var6;
}

Assistant:

inline bool Server::process_request(Stream& strm, bool last_connection, bool& connection_close)
{
    const auto bufsiz = 2048;
    char buf[bufsiz];

    detail::stream_line_reader reader(strm, buf, bufsiz);

    // Connection has been closed on client
    if (!reader.getline()) {
        return false;
    }

    Request req;
    Response res;

    res.version = "HTTP/1.1";

    // Request line and headers
    if (!parse_request_line(reader.ptr(), req) || !detail::read_headers(strm, req.headers)) {
        res.status = 400;
        write_response(strm, last_connection, req, res);
        return true;
    }

    if (req.get_header_value("Connection") == "close") {
        connection_close = true;
    }

    req.set_header("REMOTE_ADDR", strm.get_remote_addr().c_str());

    // Body
    if (req.method == "POST" || req.method == "PUT") {
        if (!detail::read_content(strm, req)) {
            res.status = 400;
            write_response(strm, last_connection, req, res);
            return true;
        }

        const auto& content_type = req.get_header_value("Content-Type");

        if (req.get_header_value("Content-Encoding") == "gzip") {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
            detail::decompress(req.body);
#else
            res.status = 415;
            write_response(strm, last_connection, req, res);
            return true;
#endif
        }

        if (!content_type.find("application/x-www-form-urlencoded")) {
            detail::parse_query_text(req.body, req.params);
        } else if(!content_type.find("multipart/form-data")) {
            std::string boundary;
            if (!detail::parse_multipart_boundary(content_type, boundary) ||
                !detail::parse_multipart_formdata(boundary, req.body, req.files)) {
                res.status = 400;
                write_response(strm, last_connection, req, res);
                return true;
            }
        }
    }

    if (routing(req, res)) {
        if (res.status == -1) {
            res.status = 200;
        }
    } else {
        res.status = 404;
    }

    write_response(strm, last_connection, req, res);
    return true;
}